

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O0

bool __thiscall AutoSystemInfo::CheckForAtom(AutoSystemInfo *this)

{
  int platformSignature;
  int ATOM_PLATFORM_F;
  int ATOM_PLATFORM_E;
  int ATOM_PLATFORM_D;
  int ATOM_PLATFORM_C;
  int ATOM_PLATFORM_B;
  int ATOM_PLATFORM_A;
  int PLATFORM_MASK;
  int GENUINE_INTEL_2;
  int GENUINE_INTEL_1;
  int GENUINE_INTEL_0;
  int CPUInfo [4];
  AutoSystemInfo *this_local;
  
  CPUInfo._8_8_ = this;
  get_cpuid(&GENUINE_INTEL_1,0);
  if ((((GENUINE_INTEL_0 == 0x756e6547) && (CPUInfo[1] == 0x49656e69)) && (CPUInfo[0] == 0x6c65746e)
      ) && ((((get_cpuid(&GENUINE_INTEL_1,1), (GENUINE_INTEL_1 & 0xfff3ff0U) == 0x106c0 ||
              ((GENUINE_INTEL_1 & 0xfff3ff0U) == 0x20660)) ||
             (((GENUINE_INTEL_1 & 0xfff3ff0U) == 0x20670 ||
              (((GENUINE_INTEL_1 & 0xfff3ff0U) == 0x30650 ||
               ((GENUINE_INTEL_1 & 0xfff3ff0U) == 0x30660)))))) ||
            ((GENUINE_INTEL_1 & 0xfff3ff0U) == 0x30670)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
AutoSystemInfo::CheckForAtom() const
{
    int CPUInfo[4];
    const int GENUINE_INTEL_0 = 0x756e6547,
              GENUINE_INTEL_1 = 0x49656e69,
              GENUINE_INTEL_2 = 0x6c65746e;
    const int PLATFORM_MASK = 0x0fff3ff0;
    const int ATOM_PLATFORM_A = 0x0106c0, /* bonnell - extended model 1c, type 0, family code 6 */
              ATOM_PLATFORM_B = 0x020660, /* lincroft - extended model 26, type 0, family code 6 */
              ATOM_PLATFORM_C = 0x020670, /* saltwell - extended model 27, type 0, family code 6 */
              ATOM_PLATFORM_D = 0x030650, /* tbd - extended model 35, type 0, family code 6 */
              ATOM_PLATFORM_E = 0x030660, /* tbd - extended model 36, type 0, family code 6 */
              ATOM_PLATFORM_F = 0x030670; /* tbd - extended model 37, type 0, family code 6 */
    int platformSignature;

    get_cpuid(CPUInfo, 0);

    // See if CPU is ATOM HW. First check if CPU is genuine Intel.
    if( CPUInfo[1]==GENUINE_INTEL_0 &&
        CPUInfo[3]==GENUINE_INTEL_1 &&
        CPUInfo[2]==GENUINE_INTEL_2)
    {
        get_cpuid(CPUInfo, 1);
        // get platform signature
        platformSignature = CPUInfo[0];
        if((( PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_A) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_B) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_C) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_D) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_E) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_F))
        {
            return true;
        }

    }
    return false;
}